

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::sendMessage
          (CommonCore *this,InterfaceHandle sourceHandle,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  atomic<int> *paVar1;
  ushort uVar2;
  pointer ppVar3;
  bool bVar4;
  int iVar5;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
  *p_Var6;
  FederateState *this_00;
  string *psVar7;
  FunctionExecutionFailure *this_01;
  InvalidParameter *pIVar8;
  ActionMessage *command;
  char *pcVar9;
  pointer_____offset_0x10___ *ppuVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  _Var11;
  long lVar12;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  __it;
  long lVar13;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view str;
  string_view fmt;
  format_args args;
  string_view message_05;
  size_t sStack_1b0;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets_1;
  undefined8 uStack_188;
  _Head_base<0UL,_helics::Message_*,_false> local_178;
  _Head_base<0UL,_helics::Message_*,_false> local_170;
  pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *local_168;
  size_type sStack_160;
  pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> local_158;
  undefined1 local_140 [32];
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ActionMessage mess;
  
  if (sourceHandle.hid == -0x1aa152) {
    bVar4 = waitCoreRegistration(this);
    if (bVar4) {
      local_170._M_head_impl =
           (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
      (message->_M_t).super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
      ActionMessage::ActionMessage
                (&mess,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       &local_170);
      CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_170);
      mess.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
      mess.source_handle.hid = -0x1aa152;
      BrokerBase::addActionMessage(&this->super_BrokerBase,&mess);
      goto LAB_0028994c;
    }
    this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
    message_00._M_str = "core is unable to register and has timed out, message was not sent";
    message_00._M_len = 0x42;
    FunctionExecutionFailure::FunctionExecutionFailure(this_01,message_00);
    ppuVar10 = &FunctionExecutionFailure::typeinfo;
    goto LAB_002899f1;
  }
  p_Var6 = getHandleInfo(this,sourceHandle);
  if (p_Var6 == (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                 *)0x0) {
    this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
    pcVar9 = "handle is not valid";
    sStack_1b0 = 0x13;
  }
  else {
    if ((p_Var6->
        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
        ).
        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
        ._M_storage._M_storage.__data[4] == 'e') {
      if (((p_Var6->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
           ._M_storage._M_storage.__data[7] & 0x40) != 0) {
        this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
        message_02._M_str =
             "Endpoint is receive only; no messages can be sent through this endpoint";
        message_02._M_len = 0x47;
        InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)this_01,message_02);
        ppuVar10 = &InvalidFunctionCall::typeinfo;
        goto LAB_002899f1;
      }
      local_178._M_head_impl =
           (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
      (message->_M_t).super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
      ActionMessage::ActionMessage
                (&mess,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       &local_178);
      CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_178);
      str._M_str = *(char **)((long)&(p_Var6->
                                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                                     ._M_storage._M_storage + 8);
      str._M_len = *(size_t *)
                    ((long)&(p_Var6->
                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                            ._M_storage._M_storage + 0x10);
      ActionMessage::setString(&mess,1,str);
      mess.source_id.gid = *(BaseType *)&(p_Var6->super__Hash_node_base)._M_nxt;
      if (mess.messageID == 0) {
        LOCK();
        paVar1 = &this->messageCounter;
        iVar5 = (paVar1->super___atomic_base<int>)._M_i;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        mess.messageID = iVar5 + 1;
      }
      mess.source_handle.hid = sourceHandle.hid;
      this_00 = getFederateAt(this,(LocalFederateId)
                                   *(BaseType *)
                                    &(p_Var6->
                                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                                     ._M_storage._M_storage);
      lVar13 = (this_00->allowed_send_time).internalTimeCode;
      if (mess.actionTime.internalTimeCode < lVar13) {
        mess.actionTime.internalTimeCode = lVar13;
      }
      iVar5 = FederateState::loggingLevel(this_00);
      if (0x11 < iVar5) {
        prettyPrintString_abi_cxx11_((string *)local_140,(helics *)&mess,command);
        local_168 = (pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     *)local_140._0_8_;
        sStack_160 = local_140._8_8_;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0xf;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_168;
        ::fmt::v11::vformat_abi_cxx11_((string *)&targets_1,(v11 *)"send_message {}",fmt,args);
        message_05._M_str =
             (char *)targets_1.
                     super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        message_05._M_len =
             (size_t)targets_1.
                     super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        FederateState::logMessage
                  (this_00,0x12,(string_view)(ZEXT816(0x35bfb2) << 0x40),message_05,false);
        std::__cxx11::string::~string((string *)&targets_1);
        std::__cxx11::string::~string((string *)local_140);
      }
      psVar7 = ActionMessage::getString_abi_cxx11_(&mess,0);
      uVar2 = *(ushort *)
               ((long)&(p_Var6->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                       ._M_storage._M_storage + 6);
      if (psVar7->_M_string_length == 0) {
        if ((uVar2 >> 10 & 1) == 0) {
          pIVar8 = (InvalidParameter *)__cxa_allocate_exception(0x28);
          message_03._M_str = "no destination specified in message";
          message_03._M_len = 0x23;
          InvalidParameter::InvalidParameter(pIVar8,message_03);
          __cxa_throw(pIVar8,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
        }
        FederateState::getMessageDestinations(&targets_1,this_00,sourceHandle);
        if (targets_1.
            super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            targets_1.
            super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          generateMessages(this,&mess,&targets_1);
        }
        std::
        _Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ::~_Vector_base(&targets_1.
                         super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       );
        goto LAB_0028994c;
      }
      if ((uVar2 >> 10 & 1) != 0) {
        FederateState::getMessageDestinations(&targets,this_00,sourceHandle);
        ppVar3 = targets.
                 super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        psVar7 = ActionMessage::getString_abi_cxx11_(&mess,0);
        std::__cxx11::string::string((string *)&local_108,psVar7);
        std::__cxx11::string::string((string *)&local_168,&local_108);
        local_140._8_8_ = sStack_160;
        targets_1.
        super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&targets_1.
                       super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (local_168 == &local_158) {
          uStack_188 = local_158.second._M_len;
          local_168 = targets_1.
                      super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        }
        sStack_160 = 0;
        local_158.first.fed_id.gid._0_1_ = 0;
        local_140._0_8_ = local_168;
        if (local_168 ==
            targets_1.
            super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_140._24_8_ = uStack_188;
          local_140._0_8_ =
               (pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *
               )(local_140 + 0x10);
        }
        targets_1.
        super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        targets_1.
        super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)(uint7)local_158.first._1_7_ << 8);
        local_168 = &local_158;
        std::__cxx11::string::~string((string *)&targets_1);
        std::__cxx11::string::string
                  ((string *)&targets_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
        lVar13 = (long)ppVar3 -
                 (long)targets.
                       super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        __it._M_current =
             targets.
             super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        for (lVar12 = lVar13 / 0x18 >> 2; _Var11._M_current = __it._M_current, 0 < lVar12;
            lVar12 = lVar12 + -1) {
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::$_0>
                  ::operator()((_Iter_pred<helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::__0>
                                *)&targets_1,__it);
          if (bVar4) goto LAB_002898f2;
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::$_0>
                  ::operator()((_Iter_pred<helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::__0>
                                *)&targets_1,__it._M_current + 1);
          _Var11._M_current = __it._M_current + 1;
          if (bVar4) goto LAB_002898f2;
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::$_0>
                  ::operator()((_Iter_pred<helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::__0>
                                *)&targets_1,__it._M_current + 2);
          _Var11._M_current = __it._M_current + 2;
          if (bVar4) goto LAB_002898f2;
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::$_0>
                  ::operator()((_Iter_pred<helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::__0>
                                *)&targets_1,__it._M_current + 3);
          _Var11._M_current = __it._M_current + 3;
          if (bVar4) goto LAB_002898f2;
          __it._M_current = __it._M_current + 4;
          lVar13 = lVar13 + -0x60;
        }
        lVar13 = lVar13 / 0x18;
        if (lVar13 == 1) {
LAB_002898df:
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::$_0>
                  ::operator()((_Iter_pred<helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::__0>
                                *)&targets_1,__it);
          _Var11._M_current = ppVar3;
          if (bVar4) {
            _Var11._M_current = __it._M_current;
          }
        }
        else if (lVar13 == 2) {
LAB_002898be:
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::$_0>
                  ::operator()((_Iter_pred<helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::__0>
                                *)&targets_1,_Var11);
          if (!bVar4) {
            __it._M_current = _Var11._M_current + 1;
            goto LAB_002898df;
          }
        }
        else {
          _Var11._M_current = ppVar3;
          if ((lVar13 == 3) &&
             (bVar4 = __gnu_cxx::__ops::
                      _Iter_pred<helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::$_0>
                      ::operator()((_Iter_pred<helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::__0>
                                    *)&targets_1,__it), _Var11._M_current = __it._M_current, !bVar4)
             ) {
            _Var11._M_current = __it._M_current + 1;
            goto LAB_002898be;
          }
        }
LAB_002898f2:
        std::__cxx11::string::~string((string *)&targets_1);
        std::__cxx11::string::~string((string *)local_140);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_108);
        if (_Var11._M_current ==
            targets.
            super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pIVar8 = (InvalidParameter *)__cxa_allocate_exception(0x28);
          message_04._M_str = "targeted endpoint destination not in target list";
          message_04._M_len = 0x30;
          InvalidParameter::InvalidParameter(pIVar8,message_04);
          __cxa_throw(pIVar8,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
        }
        std::
        _Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ::~_Vector_base(&targets.
                         super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       );
      }
      BrokerBase::addActionMessage(&this->super_BrokerBase,&mess);
LAB_0028994c:
      ActionMessage::~ActionMessage(&mess);
      return;
    }
    this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
    pcVar9 = "handle does not point to an endpoint";
    sStack_1b0 = 0x24;
  }
  message_01._M_str = pcVar9;
  message_01._M_len = sStack_1b0;
  InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message_01);
  ppuVar10 = &InvalidIdentifier::typeinfo;
LAB_002899f1:
  __cxa_throw(this_01,ppuVar10,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::sendMessage(InterfaceHandle sourceHandle, std::unique_ptr<Message> message)
{
    if (sourceHandle == gDirectSendHandle) {
        if (!waitCoreRegistration()) {
            throw(FunctionExecutionFailure(
                "core is unable to register and has timed out, message was not sent"));
        }
        ActionMessage mess(std::move(message));
        mess.source_id = global_id.load();
        mess.source_handle = sourceHandle;
        addActionMessage(std::move(mess));
        return;
    }
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }
    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    if (checkActionFlag(*hndl, receive_only_flag)) {
        throw(InvalidFunctionCall(
            "Endpoint is receive only; no messages can be sent through this endpoint"));
    }
    ActionMessage mess(std::move(message));

    mess.setString(sourceStringLoc, hndl->key);
    mess.source_id = hndl->getFederateId();
    mess.source_handle = sourceHandle;
    if (mess.messageID == 0) {
        mess.messageID = ++messageCounter;
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    auto minTime = fed->nextAllowedSendTime();
    if (mess.actionTime < minTime) {
        mess.actionTime = minTime;
    }

    if (fed->loggingLevel() >= HELICS_LOG_LEVEL_DATA) {
        fed->logMessage(HELICS_LOG_LEVEL_DATA,
                        "",
                        fmt::format("send_message {}", prettyPrintString(mess)));
    }
    if (mess.getString(targetStringLoc).empty()) {
        if (checkActionFlag(*hndl, targeted_flag)) {
            auto targets = fed->getMessageDestinations(sourceHandle);
            if (targets.empty()) {
                return;
            }
            generateMessages(mess, targets);
        } else {
            throw(InvalidParameter("no destination specified in message"));
        }
    } else {
        if (checkActionFlag(*hndl, targeted_flag)) {
            auto targets = fed->getMessageDestinations(sourceHandle);
            auto res = std::find_if(targets.begin(),
                                    targets.end(),
                                    [destination = mess.getString(targetStringLoc)](
                                        const auto& val) { return (val.second == destination); });
            if (res == targets.end()) {
                throw(InvalidParameter("targeted endpoint destination not in target list"));
            }
        }
        addActionMessage(std::move(mess));
    }
}